

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFHelper.h
# Opt level: O0

void __thiscall Assimp::DXF::PolyLine::~PolyLine(PolyLine *this)

{
  PolyLine *this_local;
  
  std::__cxx11::string::~string((string *)&this->desc);
  std::__cxx11::string::~string((string *)&this->layer);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->counts);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->indices);
  std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::~vector(&this->colors);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector(&this->positions);
  return;
}

Assistant:

PolyLine()
    : flags() {
        // empty
    }